

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_parseNamedModelWithNamedComponent_Test::~Parser_parseNamedModelWithNamedComponent_Test
          (Parser_parseNamedModelWithNamedComponent_Test *this)

{
  Parser_parseNamedModelWithNamedComponent_Test *this_local;
  
  ~Parser_parseNamedModelWithNamedComponent_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, parseNamedModelWithNamedComponent)
{
    const std::string mName = "modelName";
    const std::string cName = "componentName";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"modelName\">\n"
        "  <component name=\"componentName\"/>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(e);
    EXPECT_EQ(mName, model->name());
    libcellml::ComponentPtr c = model->component(cName);
    EXPECT_EQ(cName, c->name());

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(model);
    EXPECT_EQ(e, a);
}